

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecMem.h
# Opt level: O1

int Vec_MemHashInsert(Vec_Mem_t *p,word *pEntry)

{
  ulong uVar1;
  Vec_Int_t *pVVar2;
  uint uVar3;
  int *piVar4;
  word **ppwVar5;
  word *pwVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar12;
  ulong uVar11;
  
  pVVar2 = p->vTable;
  if (pVVar2->nSize < p->nEntries) {
    uVar12 = (ulong)(pVVar2->nSize * 2 - 1);
    while( true ) {
      do {
        uVar10 = (uint)uVar12;
        uVar9 = uVar10 + 1;
        uVar11 = (ulong)uVar9;
        uVar1 = uVar12 & 1;
        uVar12 = uVar11;
      } while (uVar1 != 0);
      if (uVar9 < 9) break;
      iVar7 = 5;
      while (uVar9 % (iVar7 - 2U) != 0) {
        uVar3 = iVar7 * iVar7;
        iVar7 = iVar7 + 2;
        if (uVar9 < uVar3) goto LAB_00791e85;
      }
    }
LAB_00791e85:
    if (pVVar2->nCap < (int)uVar9) {
      if (pVVar2->pArray == (int *)0x0) {
        piVar4 = (int *)malloc((long)(int)uVar9 << 2);
      }
      else {
        piVar4 = (int *)realloc(pVVar2->pArray,(long)(int)uVar9 << 2);
      }
      pVVar2->pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar2->nCap = uVar9;
    }
    if (uVar10 < 0x7fffffff) {
      memset(pVVar2->pArray,0xff,uVar11 << 2);
    }
    pVVar2->nSize = uVar9;
    p->vNexts->nSize = 0;
    iVar7 = p->nEntries;
    if ((0 < iVar7) && (pwVar6 = *p->ppPages, pwVar6 != (word *)0x0)) {
      uVar10 = 0;
      do {
        piVar4 = Vec_MemHashLookup(p,pwVar6 + (long)p->nEntrySize *
                                              (long)(int)(p->PageMask & uVar10));
        if (*piVar4 != -1) {
          __assert_fail("*pSpot == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                        ,0x16f,"void Vec_MemHashResize(Vec_Mem_t *)");
        }
        pVVar2 = p->vNexts;
        *piVar4 = pVVar2->nSize;
        Vec_IntPush(pVVar2,-1);
        uVar10 = uVar10 + 1;
        iVar7 = p->nEntries;
      } while (((int)uVar10 < iVar7) &&
              (pwVar6 = p->ppPages[uVar10 >> ((byte)p->LogPageSze & 0x1f)], pwVar6 != (word *)0x0));
    }
    if (iVar7 != p->vNexts->nSize) {
      __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                    ,0x173,"void Vec_MemHashResize(Vec_Mem_t *)");
    }
  }
  piVar4 = Vec_MemHashLookup(p,pEntry);
  iVar7 = *piVar4;
  if (iVar7 == -1) {
    pVVar2 = p->vNexts;
    *piVar4 = pVVar2->nSize;
    Vec_IntPush(pVVar2,-1);
    uVar10 = p->nEntries;
    if ((int)uVar10 < 0) {
      __assert_fail("i >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                    ,0xd8,"word *Vec_MemGetEntry(Vec_Mem_t *, int)");
    }
    uVar9 = uVar10 >> ((byte)p->LogPageSze & 0x1f);
    if (p->iPage < (int)uVar9) {
      iVar7 = p->nPageAlloc;
      if (iVar7 <= (int)uVar9) {
        iVar8 = uVar9 + 0x20;
        if (iVar7 != 0) {
          iVar8 = iVar7 * 2;
        }
        p->nPageAlloc = iVar8;
        if (p->ppPages == (word **)0x0) {
          ppwVar5 = (word **)malloc((long)iVar8 * 8);
        }
        else {
          ppwVar5 = (word **)realloc(p->ppPages,(long)iVar8 * 8);
        }
        p->ppPages = ppwVar5;
      }
      if (p->iPage < (int)uVar9) {
        iVar7 = p->nEntrySize;
        iVar8 = p->LogPageSze;
        uVar12 = (long)p->iPage;
        do {
          uVar1 = uVar12 + 1;
          pwVar6 = (word *)malloc((long)(iVar7 << ((byte)iVar8 & 0x1f)) << 3);
          p->ppPages[uVar12 + 1] = pwVar6;
          uVar12 = uVar1;
        } while (uVar9 != uVar1);
      }
      p->iPage = uVar9;
    }
    p->nEntries = uVar10 + 1;
    memmove(p->ppPages[uVar10 >> ((byte)p->LogPageSze & 0x1f)] +
            (long)(int)(p->PageMask & uVar10) * (long)p->nEntrySize,pEntry,(long)p->nEntrySize << 3)
    ;
    iVar7 = p->vNexts->nSize;
    if (p->nEntries != iVar7) {
      __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                    ,0x180,"int Vec_MemHashInsert(Vec_Mem_t *, word *)");
    }
    iVar7 = iVar7 + -1;
  }
  return iVar7;
}

Assistant:

static int Vec_MemHashInsert( Vec_Mem_t * p, word * pEntry )
{
    int * pSpot;
    if ( p->nEntries > Vec_IntSize(p->vTable) )
        Vec_MemHashResize( p );
    pSpot = Vec_MemHashLookup( p, pEntry );
    if ( *pSpot != -1 )
        return *pSpot;
    *pSpot = Vec_IntSize(p->vNexts);
    Vec_IntPush( p->vNexts, -1 );
    Vec_MemPush( p, pEntry );
    assert( p->nEntries == Vec_IntSize(p->vNexts) );
    return Vec_IntSize(p->vNexts) - 1;
}